

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_ProfiledSetElementI<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>_>
          *playout,PropertyOperationFlags flags)

{
  ProfileId profileId;
  FunctionBody *functionBody;
  ImplicitCallFlags flags_00;
  bool didArrayAccessHelperCall;
  bool bailedOutOnArraySpecialization;
  ScriptContext *this_00;
  ThreadContext *this_01;
  Var base;
  Var varIndex;
  Var value;
  ImplicitCallFlags savedImplicitCallFlags;
  ThreadContext *threadContext;
  PropertyOperationFlags flags_local;
  OpLayoutDynamicProfile<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>_>
  *playout_local;
  InterpreterStackFrame *this_local;
  
  this_00 = GetScriptContext(this);
  this_01 = ScriptContext::GetThreadContext(this_00);
  flags_00 = ThreadContext::GetImplicitCallFlags(this_01);
  ThreadContext::ClearImplicitCallFlags(this_01);
  base = GetReg<unsigned_int>
                   (this,(playout->
                         super_OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>).
                         Instance);
  varIndex = GetReg<unsigned_int>
                       (this,(playout->
                             super_OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>).
                             Element);
  value = GetReg<unsigned_int>
                    (this,(playout->
                          super_OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>).Value)
  ;
  functionBody = *(FunctionBody **)(this + 0x88);
  profileId = playout->profileId;
  didArrayAccessHelperCall = TestFlags(this,0x10);
  bailedOutOnArraySpecialization = TestFlags(this,0x80);
  ProfilingHelpers::ProfiledStElem
            (base,varIndex,value,functionBody,profileId,flags,didArrayAccessHelperCall,
             bailedOutOnArraySpecialization);
  ClearFlags(this,0x90);
  ThreadContext::CheckAndResetImplicitCallAccessorFlag(this_01);
  ThreadContext::AddImplicitCallFlags(this_01,flags_00);
  return;
}

Assistant:

void InterpreterStackFrame::OP_ProfiledSetElementI(
        const unaligned OpLayoutDynamicProfile<T>* playout,
        PropertyOperationFlags flags)
    {
        ThreadContext* threadContext = this->GetScriptContext()->GetThreadContext();
        ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->ClearImplicitCallFlags();

        ProfilingHelpers::ProfiledStElem(
            GetReg(playout->Instance),
            GetReg(playout->Element),
            GetReg(playout->Value),
            m_functionBody,
            playout->profileId,
            flags,
            this->TestFlags(InterpreterStackFrameFlags_ProcessingBailOutOnArrayAccessHelperCall),
            this->TestFlags(InterpreterStackFrameFlags_ProcessingBailOutOnArraySpecialization));

        this->ClearFlags(InterpreterStackFrameFlags_ProcessingBailOutOnArrayAccessHelperCall | InterpreterStackFrameFlags_ProcessingBailOutOnArraySpecialization);

        threadContext->CheckAndResetImplicitCallAccessorFlag();
        threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
    }